

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

float Search::action_hamming_loss(action a,action *A,size_t sz)

{
  size_t i;
  size_t sz_local;
  action *A_local;
  action a_local;
  float local_4;
  
  if (sz == 0) {
    local_4 = 0.0;
  }
  else {
    for (i = 0; i < sz; i = i + 1) {
      if (a == A[i]) {
        return 0.0;
      }
    }
    local_4 = 1.0;
  }
  return local_4;
}

Assistant:

float action_hamming_loss(action a, const action* A, size_t sz)
{
  if (sz == 0)
    return 0.;  // latent variables have zero loss
  for (size_t i = 0; i < sz; i++)
    if (a == A[i])
      return 0.;
  return 1.;
}